

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILoader.cpp
# Opt level: O2

void UI::LoaderLoadSceneModal(shared_ptr<LoaderThread> *loader_thread)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  float fVar3;
  ImVec2 local_20;
  char *kFilter [1];
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal("Load Scene",(bool *)0x0,0x45);
  if (bVar1) {
    kFilter[0] = "*.obj";
    ImGui::FileOpen("OBJ Filename","...",LoaderLoadSceneModal::name_buf,0x200,"OBJ Filename",1,
                    kFilter);
    ImGui::DragInt("Octree Level",&LoaderLoadSceneModal::octree_leve,1.0,1,0xc,"%d",0);
    fVar3 = ImGui::GetWindowContentRegionWidth();
    pIVar2 = ImGui::GetStyle();
    fVar3 = (fVar3 - (pIVar2->ItemSpacing).x) * 0.5;
    local_20.y = 0.0;
    local_20.x = fVar3;
    bVar1 = ImGui::Button("Load",&local_20);
    if (bVar1) {
      LoaderThread::Launch
                ((loader_thread->super___shared_ptr<LoaderThread,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,LoaderLoadSceneModal::name_buf,LoaderLoadSceneModal::octree_leve);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SetItemDefaultFocus();
    ImGui::SameLine(0.0,-1.0);
    local_20.y = 0.0;
    local_20.x = fVar3;
    bVar1 = ImGui::Button("Cancel",&local_20);
    if (bVar1) {
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void LoaderLoadSceneModal(const std::shared_ptr<LoaderThread> &loader_thread) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kLoaderLoadSceneModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		static char name_buf[kFilenameBufSize];
		static int octree_leve = 10;

		constexpr const char *kFilter[] = {"*.obj"};

		ImGui::FileOpen("OBJ Filename", "...", name_buf, kFilenameBufSize, "OBJ Filename", 1, kFilter);
		ImGui::DragInt("Octree Level", &octree_leve, 1, kOctreeLevelMin, kOctreeLevelMax);

		float button_width = (ImGui::GetWindowContentRegionWidth() - ImGui::GetStyle().ItemSpacing.x) * 0.5f;

		if (ImGui::Button("Load", {button_width, 0})) {
			loader_thread->Launch(name_buf, octree_leve);
			ImGui::CloseCurrentPopup();
		}
		ImGui::SetItemDefaultFocus();
		ImGui::SameLine();
		if (ImGui::Button("Cancel", {button_width, 0}))
			ImGui::CloseCurrentPopup();

		ImGui::EndPopup();
	}
}